

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

int ddPickArbitraryMinterms(DdManager *dd,DdNode *node,int nvars,int nminterms,char **string)

{
  int iVar1;
  uint nminterms_00;
  ulong uVar2;
  long lVar3;
  DdNode *node_00;
  uint *puVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  
  if (node != (DdNode *)0x0 && string != (char **)0x0) {
    while( true ) {
      if (nminterms == 0) {
        return 1;
      }
      if (node == (DdNode *)((ulong)dd->one ^ 1)) {
        return 1;
      }
      if (dd->one == node) {
        return 1;
      }
      puVar4 = (uint *)((ulong)node & 0xfffffffffffffffe);
      uVar2 = (ulong)node & 1;
      node_00 = (DdNode *)((ulong)*(DdNode **)(puVar4 + 4) ^ 1);
      node = (DdNode *)((ulong)*(DdNode **)(puVar4 + 6) ^ 1);
      if (uVar2 == 0) {
        node_00 = *(DdNode **)(puVar4 + 4);
        node = *(DdNode **)(puVar4 + 6);
      }
      dVar6 = Cudd_CountMinterm(dd,node_00,nvars);
      dVar6 = dVar6 * 0.5;
      if ((dVar6 == -1.0) && (!NAN(dVar6))) {
        return 0;
      }
      dVar7 = Cudd_CountMinterm(dd,node,nvars);
      dVar7 = dVar7 * 0.5;
      if ((dVar7 == -1.0) && (!NAN(dVar7))) break;
      nminterms_00 = (uint)(((double)nminterms * dVar6) / (dVar7 + dVar6) + 0.5);
      if (0 < (int)nminterms_00) {
        uVar2 = 0;
        do {
          string[uVar2][*puVar4] = '1';
          uVar2 = uVar2 + 1;
        } while (nminterms_00 != uVar2);
      }
      if (nminterms - nminterms_00 != 0 && (int)nminterms_00 <= nminterms) {
        lVar3 = (long)(int)nminterms_00;
        do {
          string[lVar3][*puVar4] = '0';
          lVar3 = lVar3 + 1;
        } while (nminterms != lVar3);
      }
      iVar1 = ddPickArbitraryMinterms(dd,node_00,nvars,nminterms_00,string);
      if (iVar1 == 0) {
        return 0;
      }
      if (node == (DdNode *)0x0) {
        return 0;
      }
      bVar5 = string == (char **)0x0;
      string = string + (int)nminterms_00;
      nminterms = nminterms - nminterms_00;
      if (bVar5) {
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

static int
ddPickArbitraryMinterms(
  DdManager *dd,
  DdNode *node,
  int nvars,
  int nminterms,
  char **string)
{
    DdNode *N, *T, *E;
    DdNode *one, *bzero;
    int    i, t, result;
    double min1, min2;

    if (string == NULL || node == NULL) return(0);

    /* The constant 0 function has no on-set cubes. */
    one = DD_ONE(dd);
    bzero = Cudd_Not(one);
    if (nminterms == 0 || node == bzero) return(1);
    if (node == one) {
        return(1);
    }

    N = Cudd_Regular(node);
    T = cuddT(N); E = cuddE(N);
    if (Cudd_IsComplement(node)) {
        T = Cudd_Not(T); E = Cudd_Not(E);
    }

    min1 = Cudd_CountMinterm(dd, T, nvars) / 2.0;
    if (min1 == (double)CUDD_OUT_OF_MEM) return(0);
    min2 = Cudd_CountMinterm(dd, E, nvars) / 2.0;
    if (min2 == (double)CUDD_OUT_OF_MEM) return(0);

    t = (int)((double)nminterms * min1 / (min1 + min2) + 0.5);
    for (i = 0; i < t; i++)
        string[i][N->index] = '1';
    for (i = t; i < nminterms; i++)
        string[i][N->index] = '0';

    result = ddPickArbitraryMinterms(dd,T,nvars,t,&string[0]);
    if (result == 0)
        return(0);
    result = ddPickArbitraryMinterms(dd,E,nvars,nminterms-t,&string[t]);
    return(result);

}